

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

void basist::astc_set_bits(uint32_t *pOutput,int *bit_pos,uint32_t value,uint32_t total_bits)

{
  int iVar1;
  int in_ECX;
  uint in_EDX;
  uint *in_RSI;
  long in_RDI;
  uint32_t bits_to_write;
  uint8_t *pBytes;
  undefined4 local_18;
  undefined4 local_14;
  
  local_14 = in_EDX;
  for (local_18 = in_ECX; local_18 != 0; local_18 = local_18 - iVar1) {
    iVar1 = basisu::minimum<int>(local_18,8 - (*in_RSI & 7));
    *(byte *)(in_RDI + ((int)*in_RSI >> 3)) =
         *(byte *)(in_RDI + ((int)*in_RSI >> 3)) | (byte)(local_14 << ((byte)*in_RSI & 7));
    *in_RSI = iVar1 + *in_RSI;
    local_14 = local_14 >> ((byte)iVar1 & 0x1f);
  }
  return;
}

Assistant:

static inline void astc_set_bits(uint32_t* pOutput, int& bit_pos, uint32_t value, uint32_t total_bits)
	{
		uint8_t* pBytes = reinterpret_cast<uint8_t*>(pOutput);

		while (total_bits)
		{
			const uint32_t bits_to_write = basisu::minimum<int>(total_bits, 8 - (bit_pos & 7));

			pBytes[bit_pos >> 3] |= static_cast<uint8_t>(value << (bit_pos & 7));

			bit_pos += bits_to_write;
			total_bits -= bits_to_write;
			value >>= bits_to_write;
		}
	}